

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureBMP180.cpp
# Opt level: O1

bool __thiscall RTPressureBMP180::pressureRead(RTPressureBMP180 *this,RTIMU_DATA *data)

{
  bool bVar1;
  
  data->pressureValid = false;
  data->temperatureValid = false;
  data->temperature = 0.0;
  data->pressure = 0.0;
  if (this->m_state == 0) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                               this->m_pressureAddr,0xf4,'.',
                               "Failed to start temperature conversion");
    if (!bVar1) {
      return false;
    }
    this->m_state = 1;
  }
  pressureBackground(this);
  if (this->m_validReadings == true) {
    data->pressureValid = true;
    data->temperatureValid = true;
    data->temperature = this->m_temperature;
    data->pressure = this->m_pressure;
  }
  return true;
}

Assistant:

bool RTPressureBMP180::pressureRead(RTIMU_DATA& data)
{
    data.pressureValid = false;
    data.temperatureValid = false;
    data.temperature = 0;
    data.pressure = 0;

    if (m_state == BMP180_STATE_IDLE) {
        // start a temperature conversion
        if (!m_settings->HALWrite(m_pressureAddr, BMP180_REG_SCO, BMP180_SCO_TEMPCONV, "Failed to start temperature conversion")) {
            return false;
        } else {
            m_state = BMP180_STATE_TEMPERATURE;
        }
    }

    pressureBackground();

    if (m_validReadings) {
        data.pressureValid = true;
        data.temperatureValid = true;
        data.temperature = m_temperature;
        data.pressure = m_pressure;
        // printf("P: %f, T: %f\n", m_pressure, m_temperature);
    }
    return true;
}